

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void SimpleHFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  longlong local_78 [2];
  longlong local_68 [2];
  longlong local_58 [2];
  longlong local_48 [3];
  
  Load16x4_SSE2(p + -2,p + (long)(stride * 8) + -2,stride,(__m128i *)local_48,&local_58,&local_68,
                &local_78);
  DoFilter2_SSE2((__m128i *)local_48,&local_58,&local_68,&local_78,thresh);
  Store16x4_SSE2((__m128i *)local_48,&local_58,&local_68,&local_78,p + -2,
                 p + (long)(stride * 8) + -2,stride);
  return;
}

Assistant:

static void SimpleHFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  __m128i p1, p0, q0, q1;

  p -= 2;  // beginning of p1

  Load16x4_SSE2(p, p + 8 * stride, stride, &p1, &p0, &q0, &q1);
  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);
  Store16x4_SSE2(&p1, &p0, &q0, &q1, p, p + 8 * stride, stride);
}